

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdHACD.cpp
# Opt level: O3

void __thiscall HACD::HACD::HACD(HACD *this,HeapManager *heapManager)

{
  undefined1 auVar1 [64];
  
  (this->m_cVertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_cVertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_cVertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  Graph::Graph(&this->m_graph);
  this->m_heapManager = heapManager;
  this->m_convexHulls = (ICHUll *)0x0;
  this->m_trianglesDecimated = (Vec3<long> *)0x0;
  this->m_pointsDecimated = (Vec3<double> *)0x0;
  this->m_triangles = (Vec3<long> *)0x0;
  this->m_points = (Vec3<double> *)0x0;
  auVar1 = ZEXT464(0) << 0x40;
  this->m_normals = (Vec3<double> *)auVar1._0_8_;
  this->m_extraDistPoints = (Vec3<double> *)auVar1._8_8_;
  this->m_extraDistNormals = (Vec3<double> *)auVar1._16_8_;
  this->m_nTrianglesDecimated = auVar1._24_8_;
  this->m_nPointsDecimated = auVar1._32_8_;
  this->m_nTriangles = auVar1._40_8_;
  this->m_nPoints = auVar1._48_8_;
  this->m_nClusters = auVar1._56_8_;
  this->m_alpha = 0.0;
  this->m_beta = 0.0;
  (this->m_barycenter).m_data[0] = 0.0;
  (this->m_barycenter).m_data[1] = 0.0;
  (this->m_barycenter).m_data[2] = 0.0;
  this->m_nVerticesPerCH = 0x1e;
  this->m_callBack = (CallBackFunction)0x0;
  this->m_partition = (long *)0x0;
  this->m_targetNTrianglesDecimatedMesh = 1000;
  this->m_addExtraDistPoints = false;
  this->m_nMinClusters = 3;
  this->m_facePoints = (Vec3<double> *)0x0;
  this->m_faceNormals = (Vec3<double> *)0x0;
  this->m_ccConnectDist = 30.0;
  this->m_concavity = 0.0;
  this->m_gamma = 0.01;
  this->m_diag = 1.0;
  this->m_scale = 1000.0;
  this->m_flatRegionThreshold = 1.0;
  this->m_smallClusterThreshold = 0.25;
  this->m_area = 0.0;
  return;
}

Assistant:

HACD::HACD(HeapManager * heapManager):m_heapManager(heapManager)
	{
		m_extraDistPoints = 0;
		m_extraDistNormals = 0;;
        m_convexHulls = 0;
		m_trianglesDecimated = 0;
        m_pointsDecimated = 0;
        m_nTrianglesDecimated = 0;
        m_nPointsDecimated = 0;
		m_triangles = 0;
        m_points = 0;
        m_normals = 0;
        m_nTriangles = 0;
        m_nPoints = 0;
        m_nClusters = 0;
        m_concavity = 0.0;
        m_diag = 1.0;
		m_barycenter = Vec3<Real>(0.0, 0.0,0.0);
        m_alpha = 0.0;
        m_beta = 0.0;
		m_gamma = 0.01;
        m_nVerticesPerCH = 30;
		m_callBack = 0;
        m_addExtraDistPoints = false;
		m_scale = 1000.0;
		m_partition = 0;
		m_nMinClusters = 3;
        m_facePoints = 0;
        m_faceNormals = 0;
        m_ccConnectDist = 30;
		m_targetNTrianglesDecimatedMesh = 1000;
		m_flatRegionThreshold = 1.0;
		m_smallClusterThreshold = 0.25;
		m_area = 0.0;					
	}